

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O2

void Gia_ManReprFromAigRepr(Aig_Man_t *pAig,Gia_Man_t *pGia)

{
  int iVar1;
  Gia_Rpr_t *pGVar2;
  long lVar3;
  Gia_Obj_t *pGVar4;
  Aig_Obj_t *pAVar5;
  void *pvVar6;
  int *piVar7;
  int v;
  
  if (pAig->pReprs == (Aig_Obj_t **)0x0) {
    __assert_fail("pAig->pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAig.c"
                  ,0x1ed,"void Gia_ManReprFromAigRepr(Aig_Man_t *, Gia_Man_t *)");
  }
  if (pGia->pReprs != (Gia_Rpr_t *)0x0) {
    __assert_fail("pGia->pReprs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAig.c"
                  ,0x1ee,"void Gia_ManReprFromAigRepr(Aig_Man_t *, Gia_Man_t *)");
  }
  iVar1 = pGia->nObjs;
  if (iVar1 - pGia->vCos->nSize != pAig->vObjs->nSize - (pAig->nDeleted + pAig->nObjs[3])) {
    __assert_fail("Gia_ManObjNum(pGia) - Gia_ManCoNum(pGia) == Aig_ManObjNum(pAig) - Aig_ManCoNum(pAig)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAig.c"
                  ,0x1ef,"void Gia_ManReprFromAigRepr(Aig_Man_t *, Gia_Man_t *)");
  }
  pGVar2 = (Gia_Rpr_t *)calloc((long)iVar1,4);
  pGia->pReprs = pGVar2;
  for (lVar3 = 0; lVar3 < iVar1; lVar3 = lVar3 + 1) {
    pGia->pReprs[lVar3] = (Gia_Rpr_t)((uint)pGia->pReprs[lVar3] | 0xfffffff);
    iVar1 = pGia->nObjs;
  }
  for (v = 0; v < iVar1; v = v + 1) {
    pGVar4 = Gia_ManObj(pGia,v);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if (-1 < (int)*(uint *)pGVar4 || (~*(uint *)pGVar4 & 0x1fffffff) == 0) {
      if (v != 0) {
        iVar1 = Abc_LitIsCompl(pGVar4->Value);
        if (iVar1 != 0) {
          __assert_fail("i == 0 || !Abc_LitIsCompl(Gia_ObjValue(pObjGia))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAig.c"
                        ,0x1f8,"void Gia_ManReprFromAigRepr(Aig_Man_t *, Gia_Man_t *)");
        }
      }
      iVar1 = Abc_Lit2Var(pGVar4->Value);
      pAVar5 = Aig_ManObj(pAig,iVar1);
      (pAVar5->field_5).iData = v;
    }
    iVar1 = pGia->nObjs;
  }
  for (lVar3 = 0; lVar3 < pAig->vObjs->nSize; lVar3 = lVar3 + 1) {
    pvVar6 = Vec_PtrEntry(pAig->vObjs,(int)lVar3);
    if (((pvVar6 != (void *)0x0) && ((*(uint *)((long)pvVar6 + 0x18) & 7) != 3)) &&
       (pAig->pReprs[lVar3] != (Aig_Obj_t *)0x0)) {
      Gia_ObjSetRepr(pGia,*(int *)((long)pvVar6 + 0x28),(pAig->pReprs[lVar3]->field_5).iData);
    }
  }
  piVar7 = Gia_ManDeriveNexts(pGia);
  pGia->pNexts = piVar7;
  return;
}

Assistant:

void Gia_ManReprFromAigRepr( Aig_Man_t * pAig, Gia_Man_t * pGia )
{
    Gia_Obj_t * pObjGia; 
    Aig_Obj_t * pObjAig, * pReprAig;
    int i;
    assert( pAig->pReprs != NULL );
    assert( pGia->pReprs == NULL );
    assert( Gia_ManObjNum(pGia) - Gia_ManCoNum(pGia) == Aig_ManObjNum(pAig) - Aig_ManCoNum(pAig) );
    pGia->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(pGia) );
    for ( i = 0; i < Gia_ManObjNum(pGia); i++ )
        Gia_ObjSetRepr( pGia, i, GIA_VOID );
    // move pointers from GIA to AIG
    Gia_ManForEachObj( pGia, pObjGia, i )
    {
        if ( Gia_ObjIsCo(pObjGia) )
            continue;
        assert( i == 0 || !Abc_LitIsCompl(Gia_ObjValue(pObjGia)) );
        pObjAig  = Aig_ManObj( pAig, Abc_Lit2Var(Gia_ObjValue(pObjGia)) );
        pObjAig->iData = i;
    }
    Aig_ManForEachObj( pAig, pObjAig, i )
    {
        if ( Aig_ObjIsCo(pObjAig) )
            continue;
        if ( pAig->pReprs[i] == NULL )
            continue;
        pReprAig = pAig->pReprs[i];
        Gia_ObjSetRepr( pGia, pObjAig->iData, pReprAig->iData );
    }
    pGia->pNexts = Gia_ManDeriveNexts( pGia );
}